

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

uint32_t re2::Prog::EmptyFlags(StringPiece *text,char *p)

{
  bool bVar1;
  bool bVar2;
  uint8_t *puVar3;
  const_pointer pcVar4;
  size_type sVar5;
  uint8_t *in_RSI;
  StringPiece *in_RDI;
  int flags;
  uint local_14;
  
  puVar3 = (uint8_t *)StringPiece::data(in_RDI);
  if (in_RSI == puVar3) {
    local_14 = 5;
  }
  else {
    local_14 = (uint)(in_RSI[-1] == '\n');
  }
  pcVar4 = StringPiece::data(in_RDI);
  sVar5 = StringPiece::size(in_RDI);
  if (in_RSI == (uint8_t *)(pcVar4 + sVar5)) {
    local_14 = local_14 | 10;
  }
  else {
    pcVar4 = StringPiece::data(in_RDI);
    sVar5 = StringPiece::size(in_RDI);
    if ((in_RSI < pcVar4 + sVar5) && (*in_RSI == '\n')) {
      local_14 = local_14 | 2;
    }
  }
  puVar3 = (uint8_t *)StringPiece::data(in_RDI);
  if (in_RSI == puVar3) {
    pcVar4 = StringPiece::data(in_RDI);
    sVar5 = StringPiece::size(in_RDI);
    if (in_RSI == (uint8_t *)(pcVar4 + sVar5)) goto LAB_0025dc46;
  }
  puVar3 = (uint8_t *)StringPiece::data(in_RDI);
  if (in_RSI == puVar3) {
    bVar1 = IsWordChar(*in_RSI);
    if (bVar1) {
      local_14 = local_14 | 0x10;
    }
  }
  else {
    pcVar4 = StringPiece::data(in_RDI);
    sVar5 = StringPiece::size(in_RDI);
    if (in_RSI == (uint8_t *)(pcVar4 + sVar5)) {
      bVar1 = IsWordChar(in_RSI[-1]);
      if (bVar1) {
        local_14 = local_14 | 0x10;
      }
    }
    else {
      bVar1 = IsWordChar(in_RSI[-1]);
      bVar2 = IsWordChar(*in_RSI);
      if (bVar1 != bVar2) {
        local_14 = local_14 | 0x10;
      }
    }
  }
LAB_0025dc46:
  if ((local_14 & 0x10) == 0) {
    local_14 = local_14 | 0x20;
  }
  return local_14;
}

Assistant:

uint32_t Prog::EmptyFlags(const StringPiece& text, const char* p) {
  int flags = 0;

  // ^ and \A
  if (p == text.data())
    flags |= kEmptyBeginText | kEmptyBeginLine;
  else if (p[-1] == '\n')
    flags |= kEmptyBeginLine;

  // $ and \z
  if (p == text.data() + text.size())
    flags |= kEmptyEndText | kEmptyEndLine;
  else if (p < text.data() + text.size() && p[0] == '\n')
    flags |= kEmptyEndLine;

  // \b and \B
  if (p == text.data() && p == text.data() + text.size()) {
    // no word boundary here
  } else if (p == text.data()) {
    if (IsWordChar(p[0]))
      flags |= kEmptyWordBoundary;
  } else if (p == text.data() + text.size()) {
    if (IsWordChar(p[-1]))
      flags |= kEmptyWordBoundary;
  } else {
    if (IsWordChar(p[-1]) != IsWordChar(p[0]))
      flags |= kEmptyWordBoundary;
  }
  if (!(flags & kEmptyWordBoundary))
    flags |= kEmptyNonWordBoundary;

  return flags;
}